

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.h
# Opt level: O0

void __thiscall slang::parsing::LexerOptions::LexerOptions(LexerOptions *this)

{
  long in_RDI;
  
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  ::unordered_flat_map(&this->commentHandlers);
  *(undefined4 *)(in_RDI + 0x30) = 0x10;
  *(undefined4 *)(in_RDI + 0x34) = 0;
  *(undefined1 *)(in_RDI + 0x38) = 0;
  return;
}

Assistant:

struct SLANG_EXPORT LexerOptions {
    /// A map of comment handlers to use when lexing directives inside comments.
    CommentHandlerMap commentHandlers;

    /// The maximum number of errors that can occur before the rest of the source
    /// buffer is skipped.
    uint32_t maxErrors = 16;

    /// The version of the SystemVerilog language to use.
    LanguageVersion languageVersion = LanguageVersion::Default;

    /// If true, the preprocessor will support legacy protected envelope directives,
    /// for compatibility with old Verilog tools.
    bool enableLegacyProtect = false;
}